

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O1

pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handleTopLevelMacro
          (pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>
           *__return_storage_ptr__,Preprocessor *this,Token directive)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  Token prevToken;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  undefined8 uVar5;
  undefined8 uVar6;
  value_type_pointer pbVar7;
  undefined1 __n [8];
  pointer __s1;
  bool bVar8;
  int iVar9;
  MacroActualArgumentListSyntax *pMVar10;
  ulong uVar11;
  uint64_t uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Diagnostic *this_00;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  Info *extraout_RDX_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  MacroActualArgumentListSyntax *pMVar13;
  group_type_pointer pgVar14;
  ulong uVar15;
  value_type *elements_1;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  char cVar20;
  char cVar22;
  char cVar23;
  char cVar24;
  undefined1 auVar21 [16];
  uchar uVar25;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  undefined1 auVar26 [16];
  uchar uVar41;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_00;
  MacroDef MVar42;
  string_view sVar43;
  Token TVar44;
  SourceRange range;
  locator res;
  value_type *elements;
  SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  alreadyExpanded;
  SmallVector<slang::parsing::Token,_32UL> buffer;
  DefineDirectiveSyntax *local_390;
  MacroIntrinsic local_388;
  undefined2 uStack_384;
  undefined2 uStack_382;
  Token local_380;
  anon_union_12_4_39e54f29_for_Trivia_0 local_370;
  undefined1 local_360 [24];
  undefined8 local_348;
  uchar uStack_340;
  uchar uStack_33f;
  uchar uStack_33e;
  uchar uStack_33d;
  uchar uStack_33c;
  uchar uStack_33b;
  uchar uStack_33a;
  uchar uStack_339;
  ulong local_338;
  ulong local_330;
  group_type_pointer local_328;
  ulong local_320;
  value_type_pointer local_318;
  ulong local_310;
  undefined1 local_308 [64];
  Storage *local_2c8;
  Storage *local_2c0;
  undefined8 local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  EVP_PKEY_CTX *local_298;
  undefined8 local_290;
  undefined1 local_280 [8];
  span<const_slang::parsing::Token,_18446744073709551615UL> local_278;
  undefined1 local_268 [520];
  BumpAllocator *pBStack_60;
  undefined1 *local_58;
  Token local_50;
  char local_40 [16];
  Info *src_00;
  
  local_278._M_extent._M_extent_value = (size_t)local_278._M_ptr;
  local_380.info = directive.info;
  local_380._0_8_ = directive._0_8_;
  MVar42 = findMacro(this,directive);
  local_390 = MVar42.syntax;
  local_388 = MVar42.intrinsic;
  uStack_384 = MVar42._12_2_;
  if ((local_390 == (DefineDirectiveSyntax *)0x0) && (local_388 == None)) {
    sVar43 = Token::valueText(&local_380);
    if (sVar43._M_len == 0) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,0)
      ;
    }
    local_280 = (undefined1  [8])(sVar43._M_len - 1);
    local_278._M_ptr = (pointer)(sVar43._M_str + 1);
    uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &(this->options).ignoreDirectives,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_280);
    __n = local_280;
    uVar15 = uVar12 >> ((byte)(this->options).ignoreDirectives.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                              .arrays.groups_size_index & 0x3f);
    pgVar14 = (this->options).ignoreDirectives.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .arrays.groups_;
    lVar19 = (uVar12 & 0xff) * 4;
    uVar25 = (&UNK_0049b57c)[lVar19];
    uVar27 = (&UNK_0049b57d)[lVar19];
    uVar28 = (&UNK_0049b57e)[lVar19];
    uVar29 = (&UNK_0049b57f)[lVar19];
    local_318 = (this->options).ignoreDirectives.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.elements_;
    __s1 = local_278._M_ptr;
    local_310 = (ulong)((uint)uVar12 & 7);
    uVar11 = (this->options).ignoreDirectives.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_size_mask;
    uVar18 = 0;
    uVar30 = uVar25;
    uVar31 = uVar27;
    uVar32 = uVar28;
    uVar33 = uVar29;
    uVar34 = uVar25;
    uVar35 = uVar27;
    uVar36 = uVar28;
    uVar37 = uVar29;
    uVar38 = uVar25;
    uVar39 = uVar27;
    uVar40 = uVar28;
    uVar41 = uVar29;
    do {
      pbVar7 = local_318;
      pgVar1 = pgVar14 + uVar15;
      auVar21[0] = -(pgVar1->m[0].n == uVar25);
      auVar21[1] = -(pgVar1->m[1].n == uVar27);
      auVar21[2] = -(pgVar1->m[2].n == uVar28);
      auVar21[3] = -(pgVar1->m[3].n == uVar29);
      auVar21[4] = -(pgVar1->m[4].n == uVar30);
      auVar21[5] = -(pgVar1->m[5].n == uVar31);
      auVar21[6] = -(pgVar1->m[6].n == uVar32);
      auVar21[7] = -(pgVar1->m[7].n == uVar33);
      auVar21[8] = -(pgVar1->m[8].n == uVar34);
      auVar21[9] = -(pgVar1->m[9].n == uVar35);
      auVar21[10] = -(pgVar1->m[10].n == uVar36);
      auVar21[0xb] = -(pgVar1->m[0xb].n == uVar37);
      auVar21[0xc] = -(pgVar1->m[0xc].n == uVar38);
      auVar21[0xd] = -(pgVar1->m[0xd].n == uVar39);
      auVar21[0xe] = -(pgVar1->m[0xe].n == uVar40);
      auVar21[0xf] = -(pgVar1->m[0xf].n == uVar41);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
      uVar16 = uVar18;
      local_320 = uVar15;
      if (uVar17 != 0) {
        local_348 = CONCAT17(uVar33,CONCAT16(uVar32,CONCAT15(uVar31,CONCAT14(uVar30,CONCAT13(uVar29,
                                                  CONCAT12(uVar28,CONCAT11(uVar27,uVar25)))))));
        uStack_340 = uVar34;
        uStack_33f = uVar35;
        uStack_33e = uVar36;
        uStack_33d = uVar37;
        uStack_33c = uVar38;
        uStack_33b = uVar39;
        uStack_33a = uVar40;
        uStack_339 = uVar41;
        local_338 = uVar18;
        local_330 = uVar11;
        local_328 = pgVar14;
        do {
          iVar9 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
            }
          }
          bVar8 = __n == (undefined1  [8])
                         *(Preprocessor **)
                          ((long)&pbVar7[uVar15 * 0xf]._M_len + (ulong)(uint)(iVar9 << 4));
          lVar19 = (long)&pbVar7[uVar15 * 0xf]._M_len + (ulong)(uint)(iVar9 << 4);
          if (bVar8 && __n != (undefined1  [8])0x0) {
            iVar9 = bcmp(__s1,*(void **)(lVar19 + 8),(size_t)__n);
            bVar8 = iVar9 == 0;
            uVar25 = (uchar)local_348;
            uVar27 = local_348._1_1_;
            uVar28 = local_348._2_1_;
            uVar29 = local_348._3_1_;
            uVar30 = local_348._4_1_;
            uVar31 = local_348._5_1_;
            uVar32 = local_348._6_1_;
            uVar33 = local_348._7_1_;
            uVar34 = uStack_340;
            uVar35 = uStack_33f;
            uVar36 = uStack_33e;
            uVar37 = uStack_33d;
            uVar38 = uStack_33c;
            uVar39 = uStack_33b;
            uVar40 = uStack_33a;
            uVar41 = uStack_339;
          }
          if (bVar8) goto LAB_0020babf;
          uVar17 = uVar17 - 1 & uVar17;
          uVar11 = local_330;
          pgVar14 = local_328;
          uVar16 = local_338;
        } while (uVar17 != 0);
      }
      if ((pgVar14[uVar15].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[local_310]) == 0) break;
      uVar18 = uVar16 + 1;
      uVar15 = local_320 + uVar16 + 1 & uVar11;
    } while (uVar18 <= uVar11);
    lVar19 = 0;
LAB_0020babf:
    if (lVar19 == 0) {
      range = Token::range(&local_380);
      this_00 = addDiag(this,(DiagCode)0x1a0004,range);
      sVar43 = Token::valueText(&local_380);
      Diagnostic::operator<<(this_00,sVar43);
      TVar44 = peek(this);
      if (TVar44.kind == OpenParenthesis) {
        local_278._M_ptr = (pointer)0x0;
        local_278._M_extent._M_extent_value = 0;
        local_268._0_4_ = 0;
        prevToken.info = local_380.info;
        prevToken.kind = local_380.kind;
        prevToken._2_1_ = local_380._2_1_;
        prevToken.numFlags.raw = local_380.numFlags.raw;
        prevToken.rawLen = local_380.rawLen;
        local_280 = (undefined1  [8])this;
        pMVar10 = MacroParser::parseActualArgumentList((MacroParser *)local_280,prevToken);
        Trivia::Trivia(&__return_storage_ptr__->second);
        __return_storage_ptr__->first = pMVar10;
        return __return_storage_ptr__;
      }
LAB_0020b532:
      Trivia::Trivia(&__return_storage_ptr__->second);
      __return_storage_ptr__->first = (MacroActualArgumentListSyntax *)0x0;
      return __return_storage_ptr__;
    }
    local_280 = (undefined1  [8])local_268;
    local_278 = (span<const_slang::parsing::Token,_18446744073709551615UL>)(ZEXT816(4) << 0x40);
    while (bVar8 = peekSameLine(this), src_00 = extraout_RDX_00, bVar8) {
      TVar44 = peek(this);
      src_00 = TVar44.info;
      if (TVar44.kind == EndOfFile) break;
      local_308._0_16_ = (undefined1  [16])consume(this);
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                ((SmallVectorBase<slang::parsing::Token> *)local_280,(Token *)local_308);
    }
    if (local_278._M_ptr == (pointer)0x0) {
      Trivia::Trivia((Trivia *)local_308);
    }
    else {
      iVar9 = SmallVectorBase<slang::parsing::Token>::copy
                        ((SmallVectorBase<slang::parsing::Token> *)local_280,
                         (EVP_PKEY_CTX *)this->alloc,(EVP_PKEY_CTX *)src_00);
      tokens_00._M_ptr._4_4_ = extraout_var_00;
      tokens_00._M_ptr._0_4_ = iVar9;
      tokens_00._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
      Trivia::Trivia((Trivia *)local_308,SkippedTokens,tokens_00);
    }
    __return_storage_ptr__->first = (MacroActualArgumentListSyntax *)0x0;
  }
  else {
    if ((local_390 == (DefineDirectiveSyntax *)0x0) ||
       (local_390->formalArguments == (MacroFormalArgumentListSyntax *)0x0)) {
      pMVar10 = (MacroActualArgumentListSyntax *)0x0;
    }
    else {
      local_278._M_ptr = (pointer)0x0;
      local_278._M_extent._M_extent_value = 0;
      local_268._0_4_ = 0;
      TVar44.info = local_380.info;
      TVar44.kind = local_380.kind;
      TVar44._2_1_ = local_380._2_1_;
      TVar44.numFlags.raw = local_380.numFlags.raw;
      TVar44.rawLen = local_380.rawLen;
      local_280 = (undefined1  [8])this;
      pMVar10 = MacroParser::parseActualArgumentList((MacroParser *)local_280,TVar44);
      if (pMVar10 == (MacroActualArgumentListSyntax *)0x0) goto LAB_0020b532;
    }
    local_280 = (undefined1  [8])local_268;
    local_278 = (span<const_slang::parsing::Token,_18446744073709551615UL>)(ZEXT816(0x20) << 0x40);
    local_268._512_8_ = this->sourceManager;
    pBStack_60 = this->alloc;
    local_58 = local_280;
    local_50.kind = local_380.kind;
    local_50._2_1_ = local_380._2_1_;
    local_50.numFlags.raw = local_380.numFlags.raw;
    local_50.rawLen = local_380.rawLen;
    local_50.info = local_380.info;
    local_40[0] = '\0';
    local_40[1] = '\x01';
    MVar42.intrinsic = local_388;
    MVar42.syntax = local_390;
    MVar42.builtIn = (bool)(undefined1)uStack_384;
    MVar42.commandLine = (bool)uStack_384._1_1_;
    MVar42._14_2_ = uStack_382;
    bVar8 = expandMacro(this,MVar42,(MacroExpansion *)(local_268 + 0x200),pMVar10);
    if (bVar8) {
      local_2c8 = (Storage *)local_308;
      local_2b8 = 0x3f;
      local_2b0 = 1;
      local_2a8 = ZEXT816(0x49b460);
      local_298 = (EVP_PKEY_CTX *)0x0;
      local_290 = 0;
      src = local_298;
      local_2c0 = local_2c8;
      if (local_388 == None) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_390;
        uVar15 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
        src = (EVP_PKEY_CTX *)&local_2b8;
        uVar11 = uVar15 >> 0x3f;
        uVar2 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar15 & 0xff];
        local_348 = 1;
        uVar18 = 0;
        do {
          lVar19 = uVar11 * 0x10;
          cVar20 = (char)uVar2;
          auVar26[0] = -((&boost::unordered::detail::foa::
                           dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                           ::storage)[lVar19] == cVar20);
          cVar22 = (char)((uint)uVar2 >> 8);
          auVar26[1] = -((&DAT_0049b461)[lVar19] == cVar22);
          cVar23 = (char)((uint)uVar2 >> 0x10);
          auVar26[2] = -((&DAT_0049b462)[lVar19] == cVar23);
          cVar24 = (char)((uint)uVar2 >> 0x18);
          auVar26[3] = -((&DAT_0049b463)[lVar19] == cVar24);
          auVar26[4] = -((&DAT_0049b464)[lVar19] == cVar20);
          auVar26[5] = -((&DAT_0049b465)[lVar19] == cVar22);
          auVar26[6] = -((&UNK_0049b466)[lVar19] == cVar23);
          auVar26[7] = -((&UNK_0049b467)[lVar19] == cVar24);
          auVar26[8] = -((&UNK_0049b468)[lVar19] == cVar20);
          auVar26[9] = -((&UNK_0049b469)[lVar19] == cVar22);
          auVar26[10] = -((&UNK_0049b46a)[lVar19] == cVar23);
          auVar26[0xb] = -((&UNK_0049b46b)[lVar19] == cVar24);
          auVar26[0xc] = -((&UNK_0049b46c)[lVar19] == cVar20);
          auVar26[0xd] = -((&UNK_0049b46d)[lVar19] == cVar22);
          auVar26[0xe] = -((&UNK_0049b46e)[lVar19] == cVar23);
          auVar26[0xf] = -((&DAT_0049b46f)[lVar19] == cVar24);
          uVar17 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
          if (uVar17 != 0) {
            do {
              uVar3 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              if (local_390 == *(DefineDirectiveSyntax **)(uVar11 * 0x78 + (ulong)uVar3 * 8)) {
                if ((ulong)uVar3 * 8 + uVar11 * 0x78 != 0) goto LAB_0020b937;
                goto LAB_0020bc1c;
              }
              uVar17 = uVar17 - 1 & uVar17;
            } while (uVar17 != 0);
          }
          if (((&DAT_0049b46f)[lVar19] &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7]) == 0) break;
          lVar19 = uVar11 + uVar18;
          uVar18 = uVar18 + 1;
          uVar11 = lVar19 + 1U & 1;
        } while (uVar18 < 2);
LAB_0020bc1c:
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
        ::unchecked_emplace_with_rehash<slang::syntax::DefineDirectiveSyntax_const*const&>
                  ((locator *)local_360,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                    *)&local_2c0,uVar15,&local_390);
        src = extraout_RDX_02;
      }
LAB_0020b937:
      iVar9 = SmallVectorBase<slang::parsing::Token>::copy
                        ((SmallVectorBase<slang::parsing::Token> *)local_280,
                         (EVP_PKEY_CTX *)this->alloc,src);
      local_360._0_8_ = CONCAT44(extraout_var,iVar9);
      pMVar13 = __return_storage_ptr__->first;
      local_360._8_8_ = extraout_RDX;
      do {
        uVar5 = local_360._0_8_;
        bVar8 = expandReplacementList
                          (this,(span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                local_360,
                           (SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                            *)local_308);
        uVar6 = local_360._0_8_;
        if (bVar8) {
          (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
          tokens._M_extent._M_extent_value = local_360._8_8_;
          tokens._M_ptr = (pointer)local_360._0_8_;
          bVar8 = applyMacroOps(this,tokens,
                                &(this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>
                               );
          iVar9 = 7;
          if (bVar8 || uVar5 != uVar6) {
            local_360._0_8_ =
                 (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_;
            local_360._8_8_ =
                 (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len;
            iVar9 = 0;
          }
        }
        else {
          Trivia::Trivia((Trivia *)&local_370);
          (__return_storage_ptr__->second).field_0.rawText.ptr = local_370.rawText.ptr;
          *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) =
               stack0xfffffffffffffc98;
          iVar9 = 1;
          pMVar13 = pMVar10;
        }
      } while (iVar9 == 0);
      if (iVar9 == 7) {
        __return_storage_ptr__->first = pMVar13;
        if ((this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len != 0) {
          this->currentMacroToken =
               (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_;
        }
        Trivia::Trivia((Trivia *)&local_370);
        __return_storage_ptr__->first = pMVar10;
        (__return_storage_ptr__->second).field_0.rawText.ptr = local_370.rawText.ptr;
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) =
             stack0xfffffffffffffc98;
      }
      else {
        __return_storage_ptr__->first = pMVar13;
      }
      local_360._0_8_ = local_2c0;
      if ((DefineDirectiveSyntax **)local_2a8._8_8_ != (DefineDirectiveSyntax **)0x0) {
        detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>::
        deallocate((StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL> *)
                   local_360,(DefineDirectiveSyntax **)local_2a8._8_8_,local_2b0 * 0x88 + 0x96U >> 3
                  );
      }
      goto LAB_0020ba94;
    }
    Trivia::Trivia((Trivia *)local_308);
    __return_storage_ptr__->first = pMVar10;
  }
  (__return_storage_ptr__->second).field_0.rawText.ptr = (char *)local_308._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) = local_308._8_8_;
LAB_0020ba94:
  if (local_280 != (undefined1  [8])local_268) {
    operator_delete((void *)local_280);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<MacroActualArgumentListSyntax*, Trivia> Preprocessor::handleTopLevelMacro(
    Token directive) {
    auto macro = findMacro(directive);
    if (!macro.valid()) {
        if (options.ignoreDirectives.find(directive.valueText().substr(1)) !=
            options.ignoreDirectives.end()) {
            SmallVector<Token, 4> ignoreTokens;
            while (peekSameLine() && peek().kind != TokenKind::EndOfFile)
                ignoreTokens.push_back(consume());

            if (ignoreTokens.empty())
                return {nullptr, Trivia()};
            else
                return {nullptr, Trivia(TriviaKind::SkippedTokens, ignoreTokens.copy(alloc))};
        }
        addDiag(diag::UnknownDirective, directive.range()) << directive.valueText();

        // If we see a parenthesis next, let's assume they tried to invoke a function-like macro
        // and skip over the tokens.
        if (peek(TokenKind::OpenParenthesis))
            return {MacroParser(*this).parseActualArgumentList(directive), Trivia()};
        return {nullptr, Trivia()};
    }

    // if this assert fires, we failed to fully expand nested macros at a previous point
    SLANG_ASSERT(!currentMacroToken);

    // parse arguments if necessary
    MacroActualArgumentListSyntax* actualArgs = nullptr;
    if (macro.needsArgs()) {
        actualArgs = MacroParser(*this).parseActualArgumentList(directive);
        if (!actualArgs)
            return {nullptr, Trivia()};
    }

    // Expand out the macro
    SmallVector<Token, 32> buffer;
    MacroExpansion expansion{sourceManager, alloc, buffer, directive, true};
    if (!expandMacro(macro, expansion, actualArgs))
        return {actualArgs, Trivia()};

    // The macro is now expanded out into tokens, but some of those tokens might
    // be more macros that need to be expanded, or special characters that
    // perform stringification or concatenation of tokens. It's possible that
    // after concatentation is performed we will have formed new valid macro
    // names that need to be expanded, which is why we loop here.
    SmallSet<const DefineDirectiveSyntax*, 8> alreadyExpanded;
    if (!macro.isIntrinsic())
        alreadyExpanded.insert(macro.syntax);

    std::span<Token const> tokens = buffer.copy(alloc);
    while (true) {
        // Start by recursively expanding out all valid macro usages. We keep track of
        // the token pointer here so that we can detect if expandReplacementList actually
        // did any work; if it did we want to ensure that we come back around for another
        // pass. This ensures that we don't miss expanding a constructed macro.
        const Token* ptr = tokens.data();
        if (!expandReplacementList(tokens, alreadyExpanded))
            return {actualArgs, Trivia()};

        // Now that all macros have been expanded, handle token concatenation and stringification.
        expandedTokens.clear();
        if (!applyMacroOps(tokens, expandedTokens) && ptr == tokens.data())
            break;

        tokens = expandedTokens;
    }

    // if the macro expanded into any tokens at all, set the pointer
    // so that we'll pull from them next
    if (!expandedTokens.empty())
        currentMacroToken = expandedTokens.begin();

    return {actualArgs, Trivia()};
}